

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void writeOutput(FILE *outf,char *groupname,dotNode *(*results) [7],int spike,int method,
                char *extrastr,float probeRad)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  atom_t *paVar5;
  atom_t *paVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  char *pcVar10;
  char *pcVar11;
  char *in_stack_fffffffffffffca8;
  undefined4 uVar12;
  char *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  float local_234;
  char local_22a [2];
  int nendstr;
  undefined1 auStack_224 [2];
  char strcName [6];
  int Lgotgapbin;
  long maxgapcounts;
  long *gapcounts;
  char acStack_208 [4];
  int gaplimit;
  char gapnamestr [22];
  undefined1 local_1df;
  undefined1 local_1de;
  undefined1 local_1dd;
  int ngapbins;
  char masterchr;
  char ptmast [7];
  char lastpointid [100];
  char local_168 [8];
  char pointid [100];
  char local_f8 [8];
  char extraMstr [32];
  char *contactstr;
  char *surfacestr;
  char *mast [7];
  char *color;
  atom *t;
  atom *a;
  dotNode *node;
  int local_68;
  int iStack_64;
  char ptm [2];
  int k;
  int j;
  int i;
  float probeRad_local;
  char *extrastr_local;
  int method_local;
  int spike_local;
  dotNode *(*results_local) [7];
  char *groupname_local;
  FILE *outf_local;
  
  node._6_2_ = 0x20;
  mast[6] = "";
  memcpy(&surfacestr,&PTR_anon_var_dwarf_e9d6_00154c90,0x38);
  extraMstr._24_8_ = anon_var_dwarf_ea36;
  memset(&local_1df,0,7);
  _acStack_208 = 0x677475767778797a;
  builtin_strncpy(gapnamestr,"rqfFQRGTUVWXYZ",0xe);
  local_234 = probeRad;
  if (probeRad <= 0.25) {
    local_234 = 0.25;
  }
  iVar7 = (int)((local_234 + local_234 + 0.5) / 0.05 + 2.0);
  pvVar9 = malloc((long)iVar7 << 3);
  stack0xfffffffffffffde0 = 0;
  _auStack_224 = 0;
  if (Lgapbins != 0) {
    for (local_68 = 0; local_68 < iVar7; local_68 = local_68 + 1) {
      *(undefined8 *)((long)pvVar9 + (long)local_68 * 8) = 0;
    }
  }
  if (LMergeContacts != 0) {
    surfacestr = (char *)extraMstr._24_8_;
    mast[0] = (char *)extraMstr._24_8_;
  }
  if (LMasterName == 0) {
    local_f8[0] = '\0';
  }
  else {
    sprintf(local_f8," master={%s}",extrastr);
  }
  fprintf((FILE *)outf,"@subgroup dominant {%s}\n",groupname);
  if (method == 0) {
    mast[0] = "surface";
    fprintf((FILE *)outf,"@master {%s}\n","surface");
  }
  else {
    if (((OutputVDWs != 0) && (OnlyBadOut == 0)) &&
       (fprintf((FILE *)outf,"@master {%s}\n",surfacestr), LMergeContacts == 0)) {
      fprintf((FILE *)outf,"@master {%s}\n",mast[0]);
    }
    if ((OutputClashes != 0) || (OnlyBadOut != 0)) {
      if (OnlyBadOut == 0) {
        fprintf((FILE *)outf,"@master {%s}\n",mast[2]);
      }
      fprintf((FILE *)outf,"@master {%s}\n",mast[3]);
      if (LworseOverlap != 0) {
        fprintf((FILE *)outf,"@master {%s}\n",mast[4]);
      }
    }
    if (((OutputHBs != 0) && (OnlyBadOut == 0)) &&
       (fprintf((FILE *)outf,"@master {%s}\n",mast[5]), LweakHbonds != 0)) {
      fprintf((FILE *)outf,"@master {%s}\n",mast[1]);
    }
  }
  if (0 < mcmccont[0][7]) {
    fprintf((FILE *)outf,"@pointmaster \'%c\' {McMc contacts}\n",0x4d);
  }
  if (0 < scsccont[0][7]) {
    fprintf((FILE *)outf,"@pointmaster \'%c\' {ScSc contacts}\n",0x53);
  }
  if (0 < mcsccont[0][7]) {
    fprintf((FILE *)outf,"@pointmaster \'%c\' {McSc contacts}\n",0x50);
  }
  if (0 < othrcont[0][7]) {
    fprintf((FILE *)outf,"@pointmaster \'%c\' {Hets contacts}\n",0x4f);
  }
  if (Lgapbins != 0) {
    for (k = 0; k < 0x16; k = k + 1) {
      fprintf((FILE *)outf,"@pointmaster \'%c\' {gap %3.2f}\n",((double)k - 11.0) / 20.0 + 0.05,
              (ulong)(uint)(int)acStack_208[k]);
    }
  }
  k = 0;
  do {
    if (0x71 < k) {
      if (Lgapbins != 0) {
        fprintf((FILE *)outf,"@text\n");
        for (local_68 = 0; local_68 < iVar7; local_68 = local_68 + 1) {
          fprintf((FILE *)outf,"{%5.2f, %8.0ld }\n",((double)local_68 - 11.0) / 20.0 + 0.05,
                  *(undefined8 *)((long)pvVar9 + (long)local_68 * 8));
        }
        fprintf((FILE *)outf,"@kinemage 2\n");
        fprintf((FILE *)outf,"@group {gapbins} dominant\n");
        fprintf((FILE *)outf,"@vectorlist {gapbins}\n");
        for (local_68 = 0; local_68 < iVar7 + -1; local_68 = local_68 + 1) {
          fprintf((FILE *)outf,"{%5.2f, %8.0ld } %5.2f, %8f, 0.00\n",
                  ((double)local_68 - 11.0) / 20.0 + 0.05,
                  (((double)local_68 - 11.0) / 20.0 + 0.05) * (double)stack0xfffffffffffffde0,
                  (double)*(long *)((long)pvVar9 + (long)local_68 * 8),
                  *(undefined8 *)((long)pvVar9 + (long)local_68 * 8));
        }
        fprintf((FILE *)outf,"@labellist {gapbins}\n");
        fprintf((FILE *)outf,"{0} 0.0, -1.0, 0.0\n");
        if (LXHvector != 0) {
          fprintf((FILE *)outf,"@kinemage 3\n");
          fprintf((FILE *)outf,"@pointmaster \'A\' {B<=10}\n");
          fprintf((FILE *)outf,"@pointmaster \'B\' {B<=15}\n");
          fprintf((FILE *)outf,"@pointmaster \'C\' {B<=20}\n");
          fprintf((FILE *)outf,"@pointmaster \'D\' {B<=25}\n");
          fprintf((FILE *)outf,"@pointmaster \'E\' {B<=30}\n");
          fprintf((FILE *)outf,"@pointmaster \'F\' {B<=40}\n");
          fprintf((FILE *)outf,"@pointmaster \'G\' {B<=50}\n");
          fprintf((FILE *)outf,"@pointmaster \'H\' {B >50}\n");
          fprintf((FILE *)outf,"@group {AXES} dominant\n");
          fprintf((FILE *)outf,"@labellist {gapbins}\n");
          for (local_68 = 0; local_68 < iVar7 + -1; local_68 = local_68 + 1) {
            fprintf((FILE *)outf,"{%5.2f} %5.2f, 0.00, 0.00\n",
                    ((double)local_68 - 11.0) / 20.0 + 0.05,
                    (((double)local_68 - 11.0) / 20.0 + 0.05) * 100.0);
          }
          for (local_68 = 0x5a; local_68 < 0xb5; local_68 = local_68 + 10) {
            fprintf((FILE *)outf,"{%5.2f} -70.0, %5.2f, 0.00\n",(double)local_68,
                    (double)(local_68 + -0x5a));
          }
          for (local_68 = 0; local_68 < 6; local_68 = local_68 + 1) {
            local_22a[local_68] = inputfilename[local_68];
          }
          fprintf((FILE *)outf,"@group {%8s} dominant animate\n",local_22a);
          fprintf((FILE *)outf,"@dotlist {gapangle}\n");
          for (k = 0; k < 0x72; k = k + 1) {
            for (iStack_64 = 0; iStack_64 < 7; iStack_64 = iStack_64 + 1) {
              a = (atom *)results[k][iStack_64];
              if (a != (atom *)0x0) {
                for (; a != (atom *)0x0; a = a->next) {
                  paVar5 = a->nextInBin;
                  paVar6 = a->scratch;
                  for (local_68 = 0; (local_68 < 10 && ((float)(local_68 * 5) <= paVar5->bval));
                      local_68 = local_68 + 1) {
                  }
                  if (local_68 < 3) {
                    node._6_2_ = CONCAT11(node._7_1_,0x41);
                  }
                  else if (local_68 < 4) {
                    node._6_2_ = CONCAT11(node._7_1_,0x42);
                  }
                  else if (local_68 < 5) {
                    node._6_2_ = CONCAT11(node._7_1_,0x43);
                  }
                  else if (local_68 < 6) {
                    node._6_2_ = CONCAT11(node._7_1_,0x44);
                  }
                  else if (local_68 < 7) {
                    node._6_2_ = CONCAT11(node._7_1_,0x45);
                  }
                  else if (local_68 < 8) {
                    node._6_2_ = CONCAT11(node._7_1_,0x46);
                  }
                  else if (local_68 < 9) {
                    node._6_2_ = CONCAT11(node._7_1_,0x47);
                  }
                  else {
                    node._6_2_ = CONCAT11(node._7_1_,0x48);
                  }
                  in_stack_fffffffffffffcb0 =
                       (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                                        (int)paVar5->r->resInsCode);
                  in_stack_fffffffffffffcc8 =
                       (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                                        (int)paVar6->altConf);
                  in_stack_fffffffffffffce0 =
                       (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                                        (int)paVar6->r->resInsCode);
                  fprintf((FILE *)outf,
                          "{%6s %s%c%s%s%c%s:O=%4.2f, B=%6.2f; %s%c%s%s%c%s:O=%4.2f, B=%6.2f; GAP %6.3f}\'%s\' %8.3f, %8.3f , %8.3f\n"
                          ,(double)paVar5->occ,(double)paVar5->bval,(double)paVar6->occ,
                          (double)paVar6->bval,(double)*(float *)((long)&(a->loc).z + 4),
                          (double)(*(float *)((long)&(a->loc).z + 4) * 100.0),
                          (double)(float)a->iz - 90.0,(double)paVar5->bval,local_22a,
                          paVar5->atomname,(ulong)(uint)(int)paVar5->altConf,paVar5->r->resname,
                          paVar5->r->Hy36resno,in_stack_fffffffffffffcb0,paVar5->r->chain,
                          paVar6->atomname,in_stack_fffffffffffffcc8,paVar6->r->resname,
                          paVar6->r->Hy36resno,in_stack_fffffffffffffce0,paVar6->r->chain,
                          (long)&node + 6);
                }
                fprintf((FILE *)outf,"\n");
              }
            }
          }
        }
      }
      return;
    }
    for (iStack_64 = 0; iStack_64 < 7; iStack_64 = iStack_64 + 1) {
      a = (atom *)results[k][iStack_64];
      if (a != (atom *)0x0) {
        if ((iStack_64 == 0) || (iStack_64 == 1)) {
          if (AtomMasters == 0) {
            if (LOneDotEach == 0) {
              pcVar10 = getColor(k);
              pcVar11 = "";
              if (LensDots != 0) {
                pcVar11 = " lens";
              }
              fprintf((FILE *)outf,"@dotlist {x} color=%s master={%s}%s%s\n",pcVar10,
                      mast[(long)iStack_64 + -1],local_f8,pcVar11);
            }
            else {
              pcVar10 = getColor(k);
              pcVar11 = "";
              if (LensDots != 0) {
                pcVar11 = " lens";
              }
              fprintf((FILE *)outf,"@balllist {x} radius=0.2 color=%s master={%s}%s%s\n",pcVar10,
                      mast[(long)iStack_64 + -1],local_f8,pcVar11);
            }
          }
          else if (LOneDotEach == 0) {
            pcVar10 = getColor(k);
            pcVar11 = getAtomName(k);
            in_stack_fffffffffffffca8 = "";
            if (LensDots != 0) {
              in_stack_fffffffffffffca8 = " lens";
            }
            fprintf((FILE *)outf,"@dotlist {x} color=%s master={%s dots} master={%s}%s%s\n",pcVar10,
                    pcVar11,mast[(long)iStack_64 + -1],local_f8,in_stack_fffffffffffffca8);
          }
          else {
            pcVar10 = getColor(k);
            pcVar11 = getAtomName(k);
            in_stack_fffffffffffffca8 = "";
            if (LensDots != 0) {
              in_stack_fffffffffffffca8 = " lens";
            }
            fprintf((FILE *)outf,
                    "@balllist {x} radius=0.2 color=%s master={%s dots} master={%s}%s%s\n",pcVar10,
                    pcVar11,mast[(long)iStack_64 + -1],local_f8,in_stack_fffffffffffffca8);
          }
        }
        else if ((((iStack_64 == 3) || (iStack_64 == 4)) || (iStack_64 == 5)) && (spike != 0)) {
          if (AtomMasters == 0) {
            if (LOneDotEach == 0) {
              pcVar10 = getColor(k);
              fprintf((FILE *)outf,"@vectorlist {x} color=%s master={%s}%s\n",pcVar10,
                      mast[(long)iStack_64 + -1],local_f8);
            }
            else {
              pcVar10 = getColor(k);
              fprintf((FILE *)outf,"@vectorlist {x} width=7 color=%s master={%s}%s\n",pcVar10,
                      mast[(long)iStack_64 + -1],local_f8);
            }
          }
          else if (LOneDotEach == 0) {
            pcVar10 = getColor(k);
            pcVar11 = getAtomName(k);
            fprintf((FILE *)outf,"@vectorlist {x} color=%s master={%s dots} master={%s}%s\n",pcVar10
                    ,pcVar11,mast[(long)iStack_64 + -1],local_f8);
          }
          else {
            pcVar10 = getColor(k);
            pcVar11 = getAtomName(k);
            fprintf((FILE *)outf,"@vectorlist {x} width=7 color=%s master={%s dots} master={%s}%s\n"
                    ,pcVar10,pcVar11,mast[(long)iStack_64 + -1],local_f8);
          }
        }
        else if (iStack_64 == 6) {
          if (AtomMasters == 0) {
            if (LOneDotEach == 0) {
              pcVar10 = getColor(k);
              fprintf((FILE *)outf,"@dotlist {x} color=%s master={%s}%s\n",pcVar10,
                      mast[(long)iStack_64 + -1],local_f8);
            }
            else {
              pcVar10 = getColor(k);
              fprintf((FILE *)outf,"@ringlist {x} radius=0.2 color=%s master={%s}%s\n",pcVar10,
                      mast[(long)iStack_64 + -1],local_f8);
            }
          }
          else if (LOneDotEach == 0) {
            pcVar10 = getColor(k);
            pcVar11 = getAtomName(k);
            fprintf((FILE *)outf,"@dotlist {x} color=%s master={%s dots} master={%s}%s\n",pcVar10,
                    pcVar11,mast[(long)iStack_64 + -1],local_f8);
          }
          else {
            pcVar10 = getColor(k);
            pcVar11 = getAtomName(k);
            fprintf((FILE *)outf,
                    "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n",pcVar10,
                    pcVar11,mast[(long)iStack_64 + -1],local_f8);
          }
        }
        else if (LweakHbonds != 0) {
          if (AtomMasters == 0) {
            if (LOneDotEach == 0) {
              pcVar10 = getColor(k);
              fprintf((FILE *)outf,"@dotlist {x} color=%s master={%s}%s\n",pcVar10,
                      mast[(long)iStack_64 + -1],local_f8);
            }
            else {
              pcVar10 = getColor(k);
              fprintf((FILE *)outf,"@ringlist {x} radius=0.2 color=%s master={%s}%s\n",pcVar10,
                      mast[(long)iStack_64 + -1],local_f8);
            }
          }
          else if (LOneDotEach == 0) {
            pcVar10 = getColor(k);
            pcVar11 = getAtomName(k);
            fprintf((FILE *)outf,"@dotlist {x} color=%s master={%s dots} master={%s}%s\n",pcVar10,
                    pcVar11,mast[(long)iStack_64 + -1],local_f8);
          }
          else {
            pcVar10 = getColor(k);
            pcVar11 = getAtomName(k);
            fprintf((FILE *)outf,
                    "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n",pcVar10,
                    pcVar11,mast[(long)iStack_64 + -1],local_f8);
          }
        }
        masterchr = '\0';
      }
      for (; a != (atom *)0x0; a = a->next) {
        paVar5 = a->nextInBin;
        paVar6 = a->scratch;
        if (Lgapbins == 0) {
          if ((char)a->ix == ' ') {
            local_1df = 0;
          }
          else {
            local_1df = 0x20;
            local_1de = 0x27;
            local_1dd = (undefined1)a->ix;
            ngapbins._0_1_ = '\'';
            ngapbins._1_1_ = 0x20;
            ngapbins._2_1_ = 0;
          }
        }
        else {
          local_1df = 0x20;
          local_1de = 0x27;
          local_1dd = (undefined1)a->ix;
          ngapbins._0_1_ = ' ';
          ngapbins._1_1_ = 0x27;
          ngapbins._2_1_ = 0x20;
          ngapbins._3_1_ = 0;
        }
        uVar12 = (undefined4)((ulong)in_stack_fffffffffffffca8 >> 0x20);
        if (LOneDotEach == 0) {
          in_stack_fffffffffffffcb0 = paVar5->r->chain;
          in_stack_fffffffffffffca8 = (char *)CONCAT44(uVar12,(int)paVar5->r->resInsCode);
          sprintf(local_168,"%s%c%s%s%c%s",paVar5->atomname,(ulong)(uint)(int)paVar5->altConf,
                  paVar5->r->resname,paVar5->r->Hy36resno,in_stack_fffffffffffffca8,
                  in_stack_fffffffffffffcb0);
        }
        else {
          in_stack_fffffffffffffcb0 = paVar5->r->chain;
          in_stack_fffffffffffffcc8 = paVar6->r->resname;
          in_stack_fffffffffffffce0 = paVar6->r->chain;
          in_stack_fffffffffffffca8 = (char *)CONCAT44(uVar12,(int)paVar5->r->resInsCode);
          in_stack_fffffffffffffcc0 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),(int)paVar6->altConf);
          in_stack_fffffffffffffcd8 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),(int)paVar6->r->resInsCode);
          sprintf(local_168,"%s%c%s%s%c%s %s%c%s%s%c%s GAP %6.3f",
                  (double)*(float *)((long)&(a->loc).z + 4),paVar5->atomname,
                  (ulong)(uint)(int)paVar5->altConf,paVar5->r->resname,paVar5->r->Hy36resno,
                  in_stack_fffffffffffffca8,in_stack_fffffffffffffcb0,paVar6->atomname,
                  in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,paVar6->r->Hy36resno,
                  in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
        }
        iVar8 = strcmp(local_168,&masterchr);
        if (iVar8 == 0) {
          fprintf((FILE *)outf,"{\"}");
        }
        else {
          strcpy(&masterchr,local_168);
          fprintf((FILE *)outf,"{%s}",local_168);
        }
        if (ColorGap != 0) {
          if (a->scratch == (atom_t *)0x0) {
            fprintf((FILE *)outf,"%s ",OutPointColor);
          }
          else {
            mast[6] = assignGapColorForKin(*(float *)((long)&(a->loc).z + 4),iStack_64);
            fprintf((FILE *)outf,"%s",mast[6]);
          }
        }
        if (Lgapbins != 0) {
          _auStack_224 = 0;
          for (local_68 = 0; local_68 < iVar7; local_68 = local_68 + 1) {
            if (*(float *)((long)&(a->loc).z + 4) < ((float)local_68 - 11.0) / 20.0 + 0.05) {
              ngapbins._0_1_ = acStack_208[local_68];
              *(long *)((long)pvVar9 + (long)local_68 * 8) =
                   *(long *)((long)pvVar9 + (long)local_68 * 8) + 1;
              if (stack0xfffffffffffffde0 < *(long *)((long)pvVar9 + (long)local_68 * 8)) {
                unique0x00012000 = *(long *)((long)pvVar9 + (long)local_68 * 8);
              }
              _auStack_224 = (uint)(local_68 < 0x16);
              break;
            }
          }
          if (_auStack_224 == 0) {
            ngapbins._0_1_ = gapnamestr[0xd];
            *(long *)((long)pvVar9 + (long)(iVar7 + -1) * 8) =
                 *(long *)((long)pvVar9 + (long)(iVar7 + -1) * 8) + 1;
          }
        }
        if ((((iStack_64 == 3) || (iStack_64 == 4)) || (iStack_64 == 5)) && (spike != 0)) {
          uVar1._0_4_ = a->mark;
          uVar1._4_4_ = a->flags;
          uVar2._0_4_ = a->props;
          uVar2._4_4_ = a->elem;
          fprintf((FILE *)outf,"P %s%.3f,%.3f,%.3f {\"}%s %s%.3f,%.3f,%.3f\n",a->bondedto,uVar1,
                  uVar2,*(undefined8 *)&a->atomclass,(a->loc).x,(a->loc).y,&local_1df,mast[6],
                  &local_1df);
        }
        else {
          uVar3._0_4_ = a->mark;
          uVar3._4_4_ = a->flags;
          uVar4._0_4_ = a->props;
          uVar4._4_4_ = a->elem;
          fprintf((FILE *)outf,"%s%.3f,%.3f,%.3f\n",a->bondedto,uVar3,uVar4,&local_1df);
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

void writeOutput(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH], int spike, int method, char* extrastr, float probeRad)
{ /*writeOutput for kinemage*/
   /*add probeRad 20111220dcr*/
   /*dcr041020 need method for better kinemage keywords*/
   /* 060129 extrastr for extra master to control orig vs fitted dots */
   int i, j;
   int k; /*counter for gapbins 111020dcr*/
   char ptm[2] = {' ','\0'}; /*20120120dcr ptmaster for bval*/
   dotNode *node;
   atom *a; /*owner of dot*/
   atom *t; /*cause of dot, output for OneDotEach mode 110113*/
   char *color = "";
  // OLD: char *mast[NODEWIDTH] = {"wide  contact", "close contact", "small overlap",
                           // "bad overlap", "H-bonds", "H-weaks"};
                            /*111215dcr weakHbonds option*/
   char *mast[NODEWIDTH] = {"wide contact", "close contact", "weak H-bonds", "small overlap", "bad overlap",
                            "worse overlap", "H-bonds"}; /* 04/13/2015 SJ changed to match new NODEWIDTH, see probe.h*/
   char *surfacestr = "surface"; /*041020*/
   char *contactstr = "vdw contact"; /*060129*/
   char extraMstr[32]; /*fill below with extra master name 060129*/
   char pointid[100], lastpointid[100];
   char ptmast[7]={'\0','\0','\0','\0','\0','\0','\0'}; /*111020dcr 6 to 7 */
   /*dcr041009 string to hold 'M' (McMc), 'S' (ScSc), 'P' (McSc), 'O' (other)*/
   /*dcr041009 ptmaster part of each dotNode member of results[][]*/
   char masterchr=' '; /*dcr041017*/
/*111020dcr gapbin ptmasters*/
   int ngapbins = 22; /*(std probe diameter .5 +clash overlap .5=1.0/0.05interval) +2*/
   /*+1 for 0th fence post, another +1 for X excess*/
   char gapnamestr[22] =
{'z','y','x','w','v','u','t','g','r','q','f','F','Q','R','G','T','U','V','W','X','Y','Z'};
/*0 , 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 ,10 ,11 ,12 ,13 ,14 ,15 ,16 ,17 ,18 ,19 ,20 ,21*/
   /*std gapbins scope at least -.5 to +.5, wider if probeRad > 0.25 standard*/
   int  gaplimit = ((2*(probeRad>0.25f?probeRad:0.25f) +0.5f)/0.05f)+2;  /*20111220dcr*/
   long *gapcounts = (long *) malloc(gaplimit * sizeof(long));
   long maxgapcounts = 0;
   int  Lgotgapbin = FALSE;
   char strcName[6]; /*first nendstr char of inputfilename 20120120dcr*/
   int  nendstr = 6;

   if(Lgapbins) /*111020dcr gapbins pointmasters, 111215dcr count bin entries*/
   {
      for(k=0; k<gaplimit;k++)
      {
         gapcounts[k] = 0;
      }
   }

   if(LMergeContacts)  /*060129*/
   {
      mast[0] = contactstr;
      mast[1] = contactstr;
   }
   if(LMasterName)  /*060129*/
   {
      sprintf(extraMstr," master={%s}",extrastr);
   }
   else{extraMstr[0] = '\0';} /*occupies no space in output*/

   fprintf(outf, "@subgroup dominant {%s}\n", groupname);
   /*list masters for contact types dcr041020*/
   if(method == EXTERNALSURFACE) /*dcr041020*/
   {/*a bit crude, but better than calling all surfaces a close contact*/
      mast[1] = surfacestr; /*the only master button invoked dcr041020*/
      fprintf(outf, "@master {%s}\n", mast[1]); /*was close contact*/
   }
   else
   {/*fine control over masters names   dcr041020*/
      if (OutputVDWs && !OnlyBadOut) { /*dcr041010*/
         fprintf(outf, "@master {%s}\n", mast[0]);
        if(!LMergeContacts)
         fprintf(outf, "@master {%s}\n", mast[1]);
      }
      if (OutputClashes || OnlyBadOut) { /*dcr041010*/
         if(!OnlyBadOut) {
             //fprintf(outf, "@master {%s}\n", mast[2]);
             fprintf(outf, "@master {%s}\n", mast[3]); /* 04/13/2015 SJ changed to match new number for small overlaps*/
         }
         //fprintf(outf, "@master {%s}\n", mast[3]); /*the Bad clashes*/
         fprintf(outf, "@master {%s}\n", mast[4]); /* 04/13/2015 SJ changed to match new number for bad overlaps*/
          if (LworseOverlap) {/* 04/13/2015 SJ if the worse overlaps are separated*/
              fprintf(outf, "@master {%s}\n", mast[5]);
          }
      }
      if (OutputHBs && !OnlyBadOut)
      { /*dcr041010*/
         //fprintf(outf, "@master {%s}\n", mast[4]);/* 04/13/2015 SJ changed to match new number for H bonds*/
         fprintf(outf, "@master {%s}\n", mast[6]);
         if(LweakHbonds) /*111215dcr*/
         {
            //fprintf(outf, "@master {%s}\n", mast[5]);
             fprintf(outf, "@master {%s}\n", mast[2]);/* 04/13/2015 SJ changed to match new number for weak H bonds*/
         }
      }
   }/*fine control over masters names*/ /* 04/15/2015 SJ changing all 5s to 7s to reflect new initialization*/
   //if(mcmccont[0][5] > 0)
   if(mcmccont[0][7] > 0)
   {
      masterchr = MCMCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {McMc contacts}\n",masterchr);
   }
   //if(scsccont[0][5] > 0)
   if(scsccont[0][7] > 0)
   {
      masterchr = SCSCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {ScSc contacts}\n",masterchr);
   }
   //if(mcsccont[0][5] > 0)
   if(mcsccont[0][7] > 0)
   {
      masterchr = MCSCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {McSc contacts}\n",masterchr);
   }
   //if(othrcont[0][5] > 0)
   if(othrcont[0][7] > 0)
   {
      masterchr = OTHERCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {Hets contacts}\n",masterchr);
   }
   if(Lgapbins) /*111020dcr*/
   {
      for(i = 0; i < ngapbins; i++)
      {
        fprintf(outf, "@pointmaster '%c' {gap %3.2f}\n"
                ,gapnamestr[i],(((float)i-11.0)/20.0)+0.05); /*20111220dcr +0.05*/
      }
   }
   for (i = 0; i < NUMATOMTYPES; i++)
   {/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
      for (j = 0; j < NODEWIDTH; j++)
      {/* OLD j: wide contact, close contact, small overlap, bad overlap, H-bonds*/
              /*OLD optionally: H-weaks if LweakHbonds  111215dcr*/
          /* NEW 04/13/2015 - SJ j: wide contact, close contact, weak H bonds, small overlap, bad overlap, worse overlap, H-bonds*/
         node = results[i][j]; /*head of list of dot nodes, i.e. first node*/
         if (node)
         {/*node exists, write list headers*/
           if (j == 0 || j == 1) /*wide and close contacts*/
           {/* contact */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@balllist {x} radius=0.2 color=%s master={%s dots} master={%s}%s%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr,
                  LensDots ? " lens" : "");
                }
                else
                {
                   fprintf(outf,
                   "@dotlist {x} color=%s master={%s dots} master={%s}%s%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr,
                   LensDots ? " lens" : "");
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                     "@balllist {x} radius=0.2 color=%s master={%s}%s%s\n",
                   getColor(i), mast[j],extraMstr,
                   LensDots ? " lens" : "");
                }
                else
                {
                    fprintf(outf,
                      "@dotlist {x} color=%s master={%s}%s%s\n",
                    getColor(i), mast[j],extraMstr,
                    LensDots ? " lens" : "");
                }
             }
           }/* contact */
          // else if ((j == 2 || j == 3) && spike)
           else if ((j == 3 || j == 4 || j == 5) && spike) /* 04/13/2015 SJ changed to reflect new numbers for different categories*/
           {/* bump w/ spike */
			  if (AtomMasters) 
              {
                 if(LOneDotEach)
                 {
					  fprintf(outf,
					  "@vectorlist {x} width=7 color=%s master={%s dots} master={%s}%s\n", 
					 getColor(i), getAtomName(i), mast[j],extraMstr); 
			     }
                 else
                 {
					 fprintf(outf,
					 "@vectorlist {x} color=%s master={%s dots} master={%s}%s\n",
					 getColor(i), getAtomName(i), mast[j],extraMstr); 
			     }
              }
              else
              {
                 if(LOneDotEach)
                 {
					fprintf(outf,
					 "@vectorlist {x} width=7 color=%s master={%s}%s\n",
					 getColor(i), mast[j],extraMstr); 
	             }
                 else
                 {
					 fprintf(outf,
					 "@vectorlist {x} color=%s master={%s}%s\n",
					 getColor(i), mast[j],extraMstr); 
			     }
              }
           }/* bump w/ spike */
           //else if (j == 4)
           else if (j == 6)/* 04/13/2015 SJ changed to reflect new numbers for different categories*/
           {/* bump w/o spike or H-bond */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                    "@dotlist {x} color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                  "@dotlist {x} color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
             }
           }/* bump w/o spike or H-bond */
           else if (LweakHbonds)
           {/* H-weak */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                    "@dotlist {x} color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                  "@dotlist {x} color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
             }
           }/* H-weak */

           lastpointid[0] = '\0'; /* reset */
         }/*node exists, write list headers*/
	 while(node)
         {/*kinemage point or point-line for each node in (ij)th dot-node list*/
            a = node->a; /*owner of dot*/
            t = node->t; /*cause of dot, use for OneDotEach 111013dcr*/
            if(Lgapbins) /*111020dcr*/
            {/*two characters for two pointmasters*/
               ptmast[0] = ' '; /*insure leading space*/
               ptmast[1] = '\''; /*surround char pointmasters with*/
               ptmast[2] = node->ptmaster;
               ptmast[3] = ' '; /*space for later gapbin character 111020dcr*/
               ptmast[4] = '\''; /*single quote marks*/
               ptmast[5] = ' '; /*need trailing space*/
               ptmast[6] = '\0'; /*end string*/
            }
            else if(node->ptmaster == ' ') /*dcr041009*/
            {/*blank means NO pointmaster*/
               ptmast[0] = '\0'; /*which will print as a zero-length str*/
            }
            else
            {
               ptmast[0] = ' '; /*insure leading space*/
               ptmast[1] = '\''; /*surround single char pointmaster with*/
               ptmast[2] = node->ptmaster;
               ptmast[3] = '\''; /*single quote marks*/
               ptmast[4] = ' '; /*need trailing space*/
               ptmast[5] = '\0'; /*end string*/
            }
/*     sprintf(pointid, "%s%c %s%d%c", */
/*       a->atomname, a->altConf, */
/*       a->r->resname, a->r->resid, */
/*       a->r->resInsCode); */
            if(LOneDotEach) /*report cause of dot after owner of dot 111013dcr*/
            {
               sprintf(pointid, "%s%c%s%s%c%s %s%c%s%s%c%s GAP %6.3f",
                  a->atomname, a->altConf,
                  a->r->resname, a->r->Hy36resno,
                  a->r->resInsCode, a->r->chain,
                  t->atomname, t->altConf,
                  t->r->resname, t->r->Hy36resno,
                  t->r->resInsCode, t->r->chain, node->gap);
            }
            else
            {/*usual just report owner of dot*/
               sprintf(pointid, "%s%c%s%s%c%s",
               a->atomname, a->altConf,
               a->r->resname, a->r->Hy36resno,
               a->r->resInsCode, a->r->chain);
            }

            if (strcmp(pointid, lastpointid))
            {
               strcpy(lastpointid, pointid);
               fprintf(outf, "{%s}", pointid);
            }
            else
            {
               fprintf(outf, "{\"}");
            }
            if (ColorGap)
            {
               if (node->t)
               {
                  color = assignGapColorForKin(node->gap, j);
                  fprintf(outf, "%s", color);
               }
               else
               {
                  fprintf(outf, "%s ", OutPointColor);
               }
               /* added "%s" string format to color and */
               /* edited "%s " to "%s" in OutPointColor, wba 110909 */
               /* edited "%s" back to "%s " in OutPointColor, gjk 1200907 */
            }
            if(Lgapbins) /*111020dcr gapbins pointmasters*/
            {
               Lgotgapbin = FALSE; /*until identify which gapbin*/
               for(k=0; k<gaplimit ;k++) /*20111220dcr ngapbins, just std range*/
               {
                  if(node->gap < (((float)k-11.0)/20.0)+0.05 )
                  {/*pt master intervals of 0.05 from -0.5 to +0.5*/
                     ptmast[3] = gapnamestr[k];
                     gapcounts[k] = gapcounts[k] +1;
                     if(gapcounts[k] > maxgapcounts){maxgapcounts = gapcounts[k];}
                     if(k < ngapbins)
                     {
                        Lgotgapbin = TRUE; /*got the gapbin idenity for this dot*/
                     }
                     break; /*out of for loop*/
                  }
               }
               if(!Lgotgapbin)
               {/*assign this node, aka dot, to overflow gapbin*/
                  ptmast[3] = gapnamestr[ngapbins-1]; /*the overflow bin-master*/
                  gapcounts[gaplimit-1] = gapcounts[gaplimit-1] +1; /*last gapbin*/
                  /*if(gapcounts[gaplimit-1] > maxgapcounts)
                          {maxgapcounts = gapcounts[gaplimit-1];}*/
               }
            }
            //if ((j == 2 || j == 3) && spike)
            if ((j == 3 || j == 4 || j == 5) && spike)/* 04/13/2015 SJ changed to reflect new numbers for different categories*/
            {/* bump */
              fprintf(outf,
                     "P %s%.3f,%.3f,%.3f {\"}%s %s%.3f,%.3f,%.3f\n", /*dcr041009*/
                      ptmast,node->loc.x, node->loc.y, node->loc.z, /*dcr041009*/
                      color,      /*** note: second color reference */
                      ptmast,node->spike.x, node->spike.y, node->spike.z); /*dcr041009*/
            }
            else
            {/* contact or H-bond */
              fprintf(outf, "%s%.3f,%.3f,%.3f\n", /*dcr041009*/
                      ptmast,node->loc.x, node->loc.y, node->loc.z); /*dcr041009*/
            }
            node = node->next; /*in this (ij)th dot-node list*/
         }/*kinemage point or point-line for each node in (ij)th dot-node list*/
      }/*OLD j: wide contact, close contact, small overlap, bad overlap, H-bonds*/ /* see new def in NODEWIDTH probe.h*/
   }/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
   if(Lgapbins) /*111020dcr gapbins pointmasters, 111215dcr count bin entries*/
   {/*Lgapbins TRUE*/
      fprintf(outf, "@text\n");
      for(k=0; k<gaplimit;k++) /*20111220dcr gaplimit*/
      {
          fprintf(outf, "{%5.2f, %8.0ld }\n",
             ((((float)k-11.0)/20.0)+0.05),gapcounts[k]);
      }

/*kinemage 2*/
      fprintf(outf, "@kinemage 2\n");
      fprintf(outf, "@group {gapbins} dominant\n");
      fprintf(outf, "@vectorlist {gapbins}\n");
      for(k=0; k<(gaplimit-1);k++) /*not plot sum of all over-wide dots*/
      {
          fprintf(outf, "{%5.2f, %8.0ld } %5.2f, %8f, 0.00\n",
             ((((float)k-11.0)/20.0)+0.05),gapcounts[k],
             ((((float)k-11.0)/20.0)+0.05)*(float)maxgapcounts,(float)gapcounts[k]);
      }
      fprintf(outf, "@labellist {gapbins}\n");
      fprintf(outf, "{0} 0.0, -1.0, 0.0\n");

/*kinemage 3*/
     if(LXHvector)
     {
      /*write list headers*/
      fprintf(outf, "@kinemage 3\n");
      /*for(k=1; k<10; k++){fprintf(outf, "@pointmaster '%d' {B<=%d}\n",k,10*k);}*/
      fprintf(outf, "@pointmaster 'A' {B<=10}\n");
      fprintf(outf, "@pointmaster 'B' {B<=15}\n");
      fprintf(outf, "@pointmaster 'C' {B<=20}\n");
      fprintf(outf, "@pointmaster 'D' {B<=25}\n");
      fprintf(outf, "@pointmaster 'E' {B<=30}\n");
      fprintf(outf, "@pointmaster 'F' {B<=40}\n");
      fprintf(outf, "@pointmaster 'G' {B<=50}\n");
      fprintf(outf, "@pointmaster 'H' {B >50}\n");

      fprintf(outf, "@group {AXES} dominant\n");
      fprintf(outf, "@labellist {gapbins}\n");
      for(k=0; k<(gaplimit-1);k++)
      {
          fprintf(outf, "{%5.2f} %5.2f, 0.00, 0.00\n",
             ((((float)k-11.0)/20.0)+0.05), 100*(((((float)k-11.0)/20.0)+0.05)) );
      }
      for(k=90; k<=180; k=k+10)
      {
         fprintf(outf, "{%5.2f} -70.0, %5.2f, 0.00\n",(float)k,(float)(k-90));
      }
      if(sizeof(inputfilename) < nendstr) {nendstr = sizeof(inputfilename);}
      for(k=0; k<nendstr; k++) {strcName[k]=inputfilename[k];}

      /*Note first nemdstr char of inputfilename 20120120dcr*/
      fprintf(outf, "@group {%8s} dominant animate\n",strcName);
      fprintf(outf, "@dotlist {gapangle}\n");

      for (i = 0; i < NUMATOMTYPES; i++)
      {/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
       for (j = 0; j < NODEWIDTH; j++)
       {/*Old: j: wide contact, close contact, small overlap, bad overlap, H-bonds*/ /* see NODEWIDTH in probe.h for new def. SJ 04/16/2015*/
              /*optionally: H-weaks if LweakHbonds  111215dcr*/
        node = results[i][j]; /*head of list of dot nodes, i.e. first node*/
        if (node)
        {/*node exists*/

         while(node)
         {/*kinemage point or point-line for each node in (ij)th dot-node list*/
           a = node->a; /*owner of dot*/
           t = node->t; /*cause of dot, use for OneDotEach 111013dcr*/
           /* Slow way to determine integer truncation of k/5 with a maximum of 9. */
           for(k=0; k<10; k++){if(a->bval < k*5) {break;}}
           /*2:10A,3:15B,4:20C,5:25D,6:30E,8:40F,10:50G*/
           if(k<=2){ptm[0] = 'A';}
           else if(k<=3){ptm[0] = 'B';}
           else if(k<=4){ptm[0] = 'C';}
           else if(k<=5){ptm[0] = 'D';}
           else if(k<=6){ptm[0] = 'E';}
           else if(k<=7){ptm[0] = 'F';}
           else if(k<=8){ptm[0] = 'G';}
           else{ptm[0] = 'H';}
           /*Note first nemdstr char of inputfilename 20120120dcr*/
           fprintf(outf,"{%6s %s%c%s%s%c%s:O=%4.2f, B=%6.2f; %s%c%s%s%c%s:O=%4.2f, B=%6.2f; GAP %6.3f}'%s' %8.3f, %8.3f , %8.3f\n",
                  strcName,
                  a->atomname, a->altConf,
                  a->r->resname, a->r->Hy36resno,
                  a->r->resInsCode, a->r->chain, a->occ, a->bval,
                  t->atomname, t->altConf,
                  t->r->resname, t->r->Hy36resno,
                  t->r->resInsCode, t->r->chain, t->occ, t->bval, node->gap, ptm,
                  100*(node->gap), (node->angle)-90.0, a->bval);

           node = node->next; /*in this (ij)th dot-node list*/
         }/*kinemage point or point-line for each node in (ij)th dot-node list*/
         fprintf(outf, "\n");
        }/*node exists*/
       }/*NODEWIDTH*/
      }/*NUMATOMTYPES*/
     }/*LXHvector*/
  }/*Lgapbins TRUE*/

}